

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O2

double ceil(double __x)

{
  HighsCDouble *in_RDI;
  double extraout_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double dVar2;
  HighsCDouble HVar3;
  
  abs((int)in_RDI);
  dVar1 = 1.0;
  dVar2 = in_RDI->hi + in_RDI->lo;
  if (1.0 <= in_XMM1_Qa + extraout_XMM0_Qa) {
    dVar1 = ceil(dVar2);
    HVar3 = HighsCDouble::operator-(in_RDI,dVar1);
    dVar2 = ceil(HVar3.hi + HVar3.lo);
    dVar1 = dVar1 + dVar2;
  }
  else if (dVar2 <= 0.0) {
    dVar1 = 0.0;
  }
  return dVar1;
}

Assistant:

HighsCDouble ceil(const HighsCDouble& x) {
    // Treat |x| < 1 as special case, as per (for example)
    // https://github.com/shibatch/tlfloat: see #2041
    if (abs(x) < 1) {
      if (x == 0 || x < 0) return HighsCDouble(0.0);
      return HighsCDouble(1.0);
    }
    double ceil_x = std::ceil(double(x));
    HighsCDouble res;

    two_sum(res.hi, res.lo, ceil_x, std::ceil(double(x - ceil_x)));
    return res;
  }